

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CustomUintFormatter<8,false>::Ser<VectorWriter,ServiceFlags>
          (CustomUintFormatter<8,_false> *this,VectorWriter *s,ServiceFlags v)

{
  long lVar1;
  size_t in_RCX;
  Span<const_std::byte> *in_RSI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar2;
  uint64_t raw;
  size_t in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff60;
  Span<unsigned_long> in_stack_ffffffffffffff70;
  undefined8 local_70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  htole64_internal(in_stack_ffffffffffffff58);
  Span<unsigned_long>::Span<unsigned_long,_0>
            ((Span<unsigned_long> *)in_RSI,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  AsBytes<unsigned_long>(in_stack_ffffffffffffff70);
  SVar2 = Span<const_std::byte>::first(in_RSI,(size_t)in_stack_ffffffffffffff60);
  local_70 = (void *)SVar2.m_size;
  VectorWriter::write((VectorWriter *)in_RSI,(int)SVar2.m_data,local_70,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }